

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void __thiscall aiNode::aiNode(aiNode *this)

{
  size_t __n;
  allocator<char> local_39;
  void *local_38;
  ulong local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  __n = 0x3ff;
  if ((local_30 & 0xfffffc00) == 0) {
    __n = local_30 & 0xffffffff;
  }
  (this->mName).length = (ai_uint32)__n;
  memcpy((this->mName).data,local_38,__n);
  (this->mName).data[__n] = '\0';
  std::__cxx11::string::~string((string *)&local_38);
  (this->mTransformation).a1 = 1.0;
  (this->mTransformation).a2 = 0.0;
  (this->mTransformation).a3 = 0.0;
  (this->mTransformation).a4 = 0.0;
  (this->mTransformation).b1 = 0.0;
  (this->mTransformation).b2 = 1.0;
  (this->mTransformation).b3 = 0.0;
  (this->mTransformation).b4 = 0.0;
  (this->mTransformation).c1 = 0.0;
  (this->mTransformation).c2 = 0.0;
  (this->mTransformation).c3 = 1.0;
  (this->mTransformation).c4 = 0.0;
  (this->mTransformation).d1 = 0.0;
  (this->mTransformation).d2 = 0.0;
  (this->mTransformation).d3 = 0.0;
  (this->mTransformation).d4 = 1.0;
  this->mParent = (aiNode *)0x0;
  this->mNumChildren = 0;
  this->mChildren = (aiNode **)0x0;
  this->mNumMeshes = 0;
  this->mMeshes = (uint *)0x0;
  this->mMetaData = (aiMetadata *)0x0;
  return;
}

Assistant:

aiNode::aiNode()
: mName("")
, mParent(nullptr)
, mNumChildren(0)
, mChildren(nullptr)
, mNumMeshes(0)
, mMeshes(nullptr)
, mMetaData(nullptr) {
    // empty
}